

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O3

void DrawRectangleRoundedLines(Rectangle rec,float roundness,int segments,int lineThick,Color color)

{
  uchar w;
  uchar z;
  int k_1;
  int iVar1;
  ulong uVar2;
  uchar y;
  uchar x;
  int k;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar10;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar11;
  Rectangle rec_00;
  float local_190;
  float local_188;
  float local_138 [3];
  undefined8 local_12c;
  float local_124;
  float local_120;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  float local_a0;
  float local_9c;
  undefined8 local_98;
  float local_90;
  float local_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_f8 = rec.width;
  fStack_e4 = rec.height;
  local_d8 = rec.x;
  fVar9 = rec.y;
  iVar1 = 0;
  if (0 < lineThick) {
    iVar1 = lineThick;
  }
  if (0.0 < roundness) {
    fVar11 = 1.0;
    if (roundness <= 1.0) {
      fVar11 = roundness;
    }
    fVar4 = fStack_e4;
    if (local_f8 <= fStack_e4) {
      fVar4 = local_f8;
    }
    fVar11 = fVar4 * fVar11 * 0.5;
    if (0.0 < fVar11) {
      fVar4 = fVar9;
      fVar8 = fVar9;
      fVar6 = fVar9;
      fVar7 = fVar9;
      if (segments < 4) {
        fVar4 = 1.0 - 0.5 / fVar11;
        fVar4 = fVar4 * fVar4;
        fStack_b0 = in_XMM1_Dc;
        local_b8 = (undefined1  [8])rec._8_8_;
        fStack_ac = in_XMM1_Dd;
        local_c8 = fVar9;
        fStack_c4 = fVar9;
        fStack_c0 = fVar9;
        fStack_bc = fVar9;
        fVar4 = acosf(fVar4 + fVar4 + -1.0);
        fVar5 = ceilf(6.2831855 / fVar4);
        fVar4 = local_c8;
        fVar8 = fStack_c4;
        fVar6 = fStack_c0;
        fVar7 = fStack_bc;
        local_f8 = (float)local_b8._0_4_;
        fStack_e4 = (float)local_b8._4_4_;
        in_XMM1_Dc = fStack_b0;
        in_XMM1_Dd = fStack_ac;
        segments = 4;
        if (0 < (int)(fVar5 * 0.5)) {
          segments = (int)(fVar5 * 0.5);
        }
      }
      fVar5 = (float)iVar1;
      fVar10 = fVar11 + fVar5;
      local_f8 = local_f8 + local_d8;
      fStack_e4 = fStack_e4 + fVar9;
      fStack_40 = in_XMM1_Dc + in_XMM0_Dc;
      fStack_3c = in_XMM1_Dd + in_XMM0_Dd;
      local_100 = local_f8 - fVar11;
      local_114 = fStack_e4 - fVar11;
      fStack_70 = fStack_40 - fVar11;
      fStack_6c = fStack_3c - fVar11;
      local_120 = fVar11 + local_d8;
      local_138[1] = fVar11 + fVar9;
      fStack_80 = fVar11 + in_XMM0_Dc;
      fStack_7c = fVar11 + in_XMM0_Dd;
      local_138[0] = local_f8 + fVar5;
      local_12c = CONCAT44(local_100,local_114);
      local_124 = fStack_e4 + fVar5;
      local_118 = local_d8 - fVar5;
      local_a8 = CONCAT44(local_138[1],local_120);
      local_98 = CONCAT44(local_114,local_100);
      z = color.b;
      y = color.g;
      x = color.r;
      local_190._0_1_ = color.a;
      w = local_190._0_1_;
      local_138[2] = local_138[0];
      local_11c = local_124;
      local_110 = local_118;
      local_10c = local_138[1];
      local_108 = local_120;
      local_104 = fVar9;
      local_fc = fVar9;
      local_f4 = local_138[1];
      local_f0 = local_f8;
      fStack_ec = local_114;
      fStack_e8 = local_100;
      local_e0 = local_120;
      local_dc = fStack_e4;
      local_d4 = local_114;
      local_d0 = local_d8;
      local_cc = local_138[1];
      local_a0 = local_100;
      local_9c = local_138[1];
      local_90 = local_120;
      local_8c = local_114;
      if (lineThick < 2) {
        rlCheckRenderBatchLimit(segments * 8 + 8);
        rlBegin(1);
        lVar3 = 0;
        do {
          if (0 < segments) {
            fVar9 = *(float *)(&local_a8 + lVar3);
            fVar11 = *(float *)((long)&local_a8 + lVar3 * 8 + 4);
            local_190 = (float)(&DAT_00163240)[lVar3];
            iVar1 = segments;
            do {
              rlColor4ub(x,y,z,w);
              fVar4 = sinf(local_190 * 0.017453292);
              fVar8 = cosf(local_190 * 0.017453292);
              rlVertex2f(fVar4 * fVar10 + fVar9,fVar8 * fVar10 + fVar11);
              local_190 = local_190 + 90.0 / (float)segments;
              fVar4 = sinf(local_190 * 0.017453292);
              fVar8 = cosf(local_190 * 0.017453292);
              rlVertex2f(fVar4 * fVar10 + fVar9,fVar8 * fVar10 + fVar11);
              iVar1 = iVar1 + -1;
            } while (iVar1 != 0);
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        uVar2 = 0xfffffffffffffffe;
        do {
          rlColor4ub(x,y,z,w);
          rlVertex2f(local_138[uVar2 * 2],local_138[uVar2 * 2 + 1]);
          rlVertex2f(local_138[uVar2 * 2 + 2],*(float *)(&local_12c + uVar2));
          uVar2 = uVar2 + 2;
        } while (uVar2 < 6);
        rlEnd();
      }
      else {
        local_b8._4_4_ = fStack_e4;
        local_b8._0_4_ = local_f8;
        fStack_b0 = fStack_40;
        fStack_ac = fStack_3c;
        local_c8 = fVar4 - fVar5;
        fStack_c4 = fVar8;
        fStack_c0 = fVar6;
        fStack_bc = fVar7;
        local_88 = local_120;
        fStack_84 = local_138[1];
        local_78 = local_100;
        fStack_74 = local_114;
        local_68 = local_138[1];
        fStack_64 = local_138[1];
        fStack_60 = local_138[1];
        fStack_5c = local_138[1];
        local_58 = local_114;
        fStack_54 = local_114;
        fStack_50 = local_114;
        fStack_4c = local_114;
        local_48 = local_138[0];
        fStack_44 = fStack_e4;
        rlCheckRenderBatchLimit(segments * 0x10 + 0x10);
        rlSetTexture(texShapes.id);
        rlBegin(7);
        lVar3 = 0;
        do {
          if (0 < segments) {
            fVar4 = *(float *)(&local_a8 + lVar3);
            fVar8 = *(float *)((long)&local_a8 + lVar3 * 8 + 4);
            local_188 = (float)(&DAT_00163240)[lVar3];
            iVar1 = segments;
            do {
              rlColor4ub(x,y,z,local_190._0_1_);
              rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                           texShapesRec.y / (float)texShapes.height);
              fVar5 = local_188 * 0.017453292;
              fVar6 = sinf(fVar5);
              fVar7 = cosf(fVar5);
              rlVertex2f(fVar6 * fVar11 + fVar4,fVar7 * fVar11 + fVar8);
              rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                           (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
              fVar6 = sinf(fVar5);
              fVar7 = cosf(fVar5);
              rlVertex2f(fVar6 * fVar10 + fVar4,fVar7 * fVar10 + fVar8);
              rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                           (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
              local_188 = local_188 + 90.0 / (float)segments;
              fVar6 = local_188 * 0.017453292;
              fVar7 = sinf(fVar6);
              fVar5 = cosf(fVar6);
              rlVertex2f(fVar7 * fVar10 + fVar4,fVar5 * fVar10 + fVar8);
              rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                           texShapesRec.y / (float)texShapes.height);
              fVar7 = sinf(fVar6);
              fVar6 = cosf(fVar6);
              rlVertex2f(fVar7 * fVar11 + fVar4,fVar6 * fVar11 + fVar8);
              iVar1 = iVar1 + -1;
            } while (iVar1 != 0);
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        rlColor4ub(x,y,z,local_190._0_1_);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        rlVertex2f(local_88,local_c8);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        rlVertex2f(local_88,fVar9);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        rlVertex2f(local_78,fVar9);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        rlVertex2f(local_78,local_c8);
        rlColor4ub(x,y,z,local_190._0_1_);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        rlVertex2f(local_48,local_68);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        rlVertex2f((float)local_b8._0_4_,local_68);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        rlVertex2f((float)local_b8._0_4_,local_58);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        rlVertex2f(local_48,local_58);
        rlColor4ub(x,y,z,local_190._0_1_);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        rlVertex2f(local_e0,local_dc);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        rlVertex2f(local_120,local_11c);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        rlVertex2f(local_12c._4_4_,local_124);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        rlVertex2f(fStack_e8,fStack_e4);
        rlColor4ub(x,y,z,local_190._0_1_);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        rlVertex2f(local_d0,local_cc);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        rlVertex2f(local_110,local_10c);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        rlVertex2f(local_118,local_114);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        rlVertex2f(local_d8,local_d4);
        rlEnd();
        rlSetTexture(0);
      }
    }
    return;
  }
  rec_00.width = (float)(iVar1 * 2) + local_f8;
  rec_00.height = (float)(iVar1 * 2) + fStack_e4;
  rec_00.y = fVar9 - (float)iVar1;
  rec_00.x = local_d8 - (float)iVar1;
  DrawRectangleLinesEx(rec_00,iVar1,color);
  return;
}

Assistant:

void DrawRectangleRoundedLines(Rectangle rec, float roundness, int segments, int lineThick, Color color)
{
    if (lineThick < 0) lineThick = 0;

    // Not a rounded rectangle
    if (roundness <= 0.0f)
    {
        DrawRectangleLinesEx((Rectangle){rec.x-lineThick, rec.y-lineThick, rec.width+2*lineThick, rec.height+2*lineThick}, lineThick, color);
        return;
    }

    if (roundness >= 1.0f) roundness = 1.0f;

    // Calculate corner radius
    float radius = (rec.width > rec.height)? (rec.height*roundness)/2 : (rec.width*roundness)/2;
    if (radius <= 0.0f) return;

    // Calculate number of segments to use for the corners
    if (segments < 4)
    {
        // Calculate the maximum angle between segments based on the error rate (usually 0.5f)
        float th = acosf(2*powf(1 - SMOOTH_CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = (int)(ceilf(2*PI/th)/2.0f);
        if (segments <= 0) segments = 4;
    }

    float stepLength = 90.0f/(float)segments;
    const float outerRadius = radius + (float)lineThick, innerRadius = radius;

    /*
    Quick sketch to make sense of all of this,
    marks the 16 + 4(corner centers P16-19) points we'll use

           P0 ================== P1
          // P8                P9 \\
         //                        \\
     P7 // P15                  P10 \\ P2
       ||   *P16             P17*    ||
       ||                            ||
       || P14                   P11  ||
     P6 \\  *P19             P18*   // P3
         \\                        //
          \\ P13              P12 //
           P5 ================== P4
    */
    const Vector2 point[16] = {
        {(float)rec.x + innerRadius, rec.y - lineThick}, {(float)(rec.x + rec.width) - innerRadius, rec.y - lineThick}, { rec.x + rec.width + lineThick, (float)rec.y + innerRadius }, // PO, P1, P2
        {rec.x + rec.width + lineThick, (float)(rec.y + rec.height) - innerRadius}, {(float)(rec.x + rec.width) - innerRadius, rec.y + rec.height + lineThick}, // P3, P4
        {(float)rec.x + innerRadius, rec.y + rec.height + lineThick}, { rec.x - lineThick, (float)(rec.y + rec.height) - innerRadius}, {rec.x - lineThick, (float)rec.y + innerRadius}, // P5, P6, P7
        {(float)rec.x + innerRadius, rec.y}, {(float)(rec.x + rec.width) - innerRadius, rec.y}, // P8, P9
        { rec.x + rec.width, (float)rec.y + innerRadius }, {rec.x + rec.width, (float)(rec.y + rec.height) - innerRadius}, // P10, P11
        {(float)(rec.x + rec.width) - innerRadius, rec.y + rec.height}, {(float)rec.x + innerRadius, rec.y + rec.height}, // P12, P13
        { rec.x, (float)(rec.y + rec.height) - innerRadius}, {rec.x, (float)rec.y + innerRadius} // P14, P15
    };

    const Vector2 centers[4] = {
        {(float)rec.x + innerRadius, (float)rec.y + innerRadius}, {(float)(rec.x + rec.width) - innerRadius, (float)rec.y + innerRadius}, // P16, P17
        {(float)(rec.x + rec.width) - innerRadius, (float)(rec.y + rec.height) - innerRadius}, {(float)rec.x + innerRadius, (float)(rec.y + rec.height) - innerRadius} // P18, P19
    };

    const float angles[4] = { 180.0f, 90.0f, 0.0f, 270.0f };

    if (lineThick > 1)
    {
#if defined(SUPPORT_QUADS_DRAW_MODE)
        rlCheckRenderBatchLimit(4*4*segments + 4*4); // 4 corners with 4 vertices for each segment + 4 rectangles with 4 vertices each

        rlSetTexture(texShapes.id);

        rlBegin(RL_QUADS);

            // Draw all of the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
            for (int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
            {
                float angle = angles[k];
                const Vector2 center = centers[k];
                for (int i = 0; i < segments; i++)
                {
                    rlColor4ub(color.r, color.g, color.b, color.a);
                    rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
                    rlVertex2f(center.x + sinf(DEG2RAD*angle)*innerRadius, center.y + cosf(DEG2RAD*angle)*innerRadius);
                    rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                    rlVertex2f(center.x + sinf(DEG2RAD*angle)*outerRadius, center.y + cosf(DEG2RAD*angle)*outerRadius);
                    rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                    rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*outerRadius);
                    rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
                    rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*innerRadius);

                    angle += stepLength;
                }
            }

            // Upper rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(point[0].x, point[0].y);
            rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(point[8].x, point[8].y);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(point[9].x, point[9].y);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(point[1].x, point[1].y);

            // Right rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(point[2].x, point[2].y);
            rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(point[10].x, point[10].y);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(point[11].x, point[11].y);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(point[3].x, point[3].y);

            // Lower rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(point[13].x, point[13].y);
            rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(point[5].x, point[5].y);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(point[4].x, point[4].y);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(point[12].x, point[12].y);

            // Left rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(point[15].x, point[15].y);
            rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(point[7].x, point[7].y);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(point[6].x, point[6].y);
            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(point[14].x, point[14].y);

        rlEnd();
        rlSetTexture(0);
#else
        rlCheckRenderBatchLimit(4*6*segments + 4*6); // 4 corners with 6(2*3) vertices for each segment + 4 rectangles with 6 vertices each

        rlBegin(RL_TRIANGLES);

            // Draw all of the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
            for (int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
            {
                float angle = angles[k];
                const Vector2 center = centers[k];

                for (int i = 0; i < segments; i++)
                {
                    rlColor4ub(color.r, color.g, color.b, color.a);

                    rlVertex2f(center.x + sinf(DEG2RAD*angle)*innerRadius, center.y + cosf(DEG2RAD*angle)*innerRadius);
                    rlVertex2f(center.x + sinf(DEG2RAD*angle)*outerRadius, center.y + cosf(DEG2RAD*angle)*outerRadius);
                    rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*innerRadius);

                    rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*innerRadius);
                    rlVertex2f(center.x + sinf(DEG2RAD*angle)*outerRadius, center.y + cosf(DEG2RAD*angle)*outerRadius);
                    rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*outerRadius);

                    angle += stepLength;
                }
            }

            // Upper rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(point[0].x, point[0].y);
            rlVertex2f(point[8].x, point[8].y);
            rlVertex2f(point[9].x, point[9].y);
            rlVertex2f(point[1].x, point[1].y);
            rlVertex2f(point[0].x, point[0].y);
            rlVertex2f(point[9].x, point[9].y);

            // Right rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(point[10].x, point[10].y);
            rlVertex2f(point[11].x, point[11].y);
            rlVertex2f(point[3].x, point[3].y);
            rlVertex2f(point[2].x, point[2].y);
            rlVertex2f(point[10].x, point[10].y);
            rlVertex2f(point[3].x, point[3].y);

            // Lower rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(point[13].x, point[13].y);
            rlVertex2f(point[5].x, point[5].y);
            rlVertex2f(point[4].x, point[4].y);
            rlVertex2f(point[12].x, point[12].y);
            rlVertex2f(point[13].x, point[13].y);
            rlVertex2f(point[4].x, point[4].y);

            // Left rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(point[7].x, point[7].y);
            rlVertex2f(point[6].x, point[6].y);
            rlVertex2f(point[14].x, point[14].y);
            rlVertex2f(point[15].x, point[15].y);
            rlVertex2f(point[7].x, point[7].y);
            rlVertex2f(point[14].x, point[14].y);
        rlEnd();
#endif
    }
    else
    {
        // Use LINES to draw the outline
        rlCheckRenderBatchLimit(8*segments + 4*2); // 4 corners with 2 vertices for each segment + 4 rectangles with 2 vertices each

        rlBegin(RL_LINES);

            // Draw all of the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
            for (int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
            {
                float angle = angles[k];
                const Vector2 center = centers[k];

                for (int i = 0; i < segments; i++)
                {
                    rlColor4ub(color.r, color.g, color.b, color.a);
                    rlVertex2f(center.x + sinf(DEG2RAD*angle)*outerRadius, center.y + cosf(DEG2RAD*angle)*outerRadius);
                    rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*outerRadius);
                    angle += stepLength;
                }
            }

            // And now the remaining 4 lines
            for (int i = 0; i < 8; i += 2)
            {
                rlColor4ub(color.r, color.g, color.b, color.a);
                rlVertex2f(point[i].x, point[i].y);
                rlVertex2f(point[i + 1].x, point[i + 1].y);
            }

        rlEnd();
    }
}